

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::_process_callbacks(App *this)

{
  pointer psVar1;
  App *pAVar2;
  pointer puVar3;
  Option *this_00;
  size_t sVar4;
  Option_p *opt;
  pointer puVar5;
  pointer psVar6;
  
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    pAVar2 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((pAVar2->name_)._M_string_length == 0) &&
       ((pAVar2->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
      sVar4 = count_all(pAVar2);
      if (sVar4 != 0) {
        _process_callbacks((psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                          );
        run_callback((psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,false
                     ,false);
      }
    }
  }
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    this_00 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((((this_00->results_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(this_00->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8)) || ((this_00->force_callback_ & 1U) != 0)) &&
       (this_00->current_option_state_ != callback_run)) {
      Option::run_callback(this_00);
    }
  }
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    pAVar2 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((pAVar2->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      _process_callbacks(pAVar2);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_callbacks() {

    for(App_p &sub : subcommands_) {
        // process the priority option_groups first
        if(sub->get_name().empty() && sub->parse_complete_callback_) {
            if(sub->count_all() > 0) {
                sub->_process_callbacks();
                sub->run_callback();
            }
        }
    }

    for(const Option_p &opt : options_) {
        if((*opt) && !opt->get_callback_run()) {
            opt->run_callback();
        }
    }
    for(App_p &sub : subcommands_) {
        if(!sub->parse_complete_callback_) {
            sub->_process_callbacks();
        }
    }
}